

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O2

void __thiscall PathTest::PartsTest(PathTest *this)

{
  bool bVar1;
  char **ppcVar2;
  ulong uVar3;
  Path p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  ppcVar2 = &partsTestData[0].filenameExtention;
  for (uVar3 = 0; uVar3 != 10; uVar3 = uVar3 + 1) {
    JetHead::Path::Path((Path *)local_50,((PartsTestData *)(ppcVar2 + -4))->path);
    JetHead::Path::parent();
    bVar1 = std::operator!=(&local_70,ppcVar2[-3]);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      JetHead::Path::parent();
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xac,"parent failed %d \"%s\"",uVar3 & 0xffffffff,local_70._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_70);
    }
    JetHead::Path::filename_abi_cxx11_();
    bVar1 = std::operator!=(&local_70,ppcVar2[-2]);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      JetHead::Path::filename_abi_cxx11_();
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xae,"filename failed %d \"%s\"",uVar3 & 0xffffffff,local_70._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_70);
    }
    JetHead::Path::fileBasename_abi_cxx11_();
    bVar1 = std::operator!=(&local_70,ppcVar2[-1]);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      JetHead::Path::fileBasename_abi_cxx11_();
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xb0,"fileBasename failed %d \"%s\"",uVar3 & 0xffffffff,local_70._M_dataplus._M_p)
      ;
      std::__cxx11::string::~string((string *)&local_70);
    }
    JetHead::Path::filenameExtention_abi_cxx11_();
    bVar1 = std::operator!=(&local_70,*ppcVar2);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      JetHead::Path::filenameExtention_abi_cxx11_();
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xb2,"filenameExtention failed %d \"%s\"",uVar3 & 0xffffffff,
                 local_70._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string(local_50);
    ppcVar2 = ppcVar2 + 5;
  }
  return;
}

Assistant:

void PathTest::PartsTest()
{
	for ( int i = 0; i < JH_ARRAY_SIZE( partsTestData ); i++ )
	{
		Path p( partsTestData[ i ].path );
		if ( p.parent() != partsTestData[ i ].parent )
			TestFailed( "parent failed %d \"%s\"", i, p.parent().getString().c_str() );
		if ( p.filename() != partsTestData[ i ].filename )
			TestFailed( "filename failed %d \"%s\"", i, p.filename().c_str() );
		if ( p.fileBasename() != partsTestData[ i ].fileBasename )
			TestFailed( "fileBasename failed %d \"%s\"", i, p.fileBasename().c_str() );
		if ( p.filenameExtention() != partsTestData[ i ].filenameExtention )
			TestFailed( "filenameExtention failed %d \"%s\"", i, p.filenameExtention().c_str() );
	}
}